

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O0

Chuck * SplitIfWorthy(Chuck *chuck,Size size)

{
  uint8_t uVar1;
  Size SVar2;
  ulong size_00;
  Chuck *higher_00;
  Chuck *avail;
  Chuck *higher;
  Chuck *lower;
  Size size_local;
  Chuck *chuck_local;
  
  uVar1 = GetUsed(chuck);
  if (uVar1 != '\0') {
    __assert_fail("!GetUsed(chuck)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                  ,0x89,"Chuck *SplitIfWorthy(Chuck *, Size)");
  }
  SVar2 = GetSize(chuck);
  if (size <= SVar2) {
    lower = (Chuck *)size;
    if (size < 0x18) {
      lower = (Chuck *)0x18;
    }
    size_00 = (ulong)&lower->field_0x7 & 0xfffffffffffffff8;
    SVar2 = GetSize(chuck);
    if (SVar2 < size_00 + 0x18) {
      chuck_local = (Chuck *)0x0;
    }
    else {
      higher_00 = GetHigher(chuck);
      SetSize(chuck,size_00);
      chuck_local = GetHigher(chuck);
      SetUsed(chuck,'\0');
      SetLower(chuck_local,chuck);
      SetHigher(chuck_local,higher_00);
    }
    return chuck_local;
  }
  __assert_fail("size <= GetSize(chuck)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,0x8a,"Chuck *SplitIfWorthy(Chuck *, Size)");
}

Assistant:

static Chuck *SplitIfWorthy(Chuck *chuck, Size size) {
    assert(!GetUsed(chuck));
    assert(size <= GetSize(chuck));
    if (size < sizeof(Chuck)) {
        size = sizeof(Chuck);
    }
    size = (size + 0x07u) >> 3u << 3u;
    // split to get a chuck whose size equals to sizeof(Chuck) is still worthy
    // it could store sizeof(Chuck) - OVERHEAD_OF_USED_CHUCK bytes data
    if (GetSize(chuck) < size + sizeof(Chuck)) {
        return NULL;
    }
    Chuck *lower = chuck, *higher = GetHigher(chuck);
    SetSize(lower, size);
    Chuck *avail = GetHigher(lower);
    // SetUsed(avail, 0);
    SetUsed(lower, 0);
    // a little worry that compiler is not clever enough to eliminate this
    SetLower(avail, lower);
    SetHigher(avail, higher);
    return avail;
}